

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

void __thiscall
CFG::Relooper::Calculate(CFG::Block*)::Analyzer::FindIndependentGroups(wasm::InsertOrderedSet<CFG::
Block*>&,wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG::Block*>>&,wasm::
InsertOrderedSet<CFG::Block_>__
          (void *this,BlockSet *Entries,BlockBlockSetMap *IndependentGroups,BlockSet *Ignore)

{
  mapped_type pBVar1;
  Block *pBVar2;
  bool bVar3;
  size_type sVar4;
  reference ppBVar5;
  mapped_type *ppBVar6;
  BlockBranchMap *pBVar7;
  reference __in;
  type *__x;
  InsertOrderedSet<CFG::Block_*> *pIVar8;
  pointer ppVar9;
  BlockSet *this_00;
  reference ppBVar10;
  size_t sVar11;
  Block *local_1a8;
  Block *Entry_2;
  iterator __end2_2;
  iterator __begin2_2;
  BlockSet *__range2_2;
  Block *Invalidatee;
  Block *Parent;
  iterator __end4;
  iterator __begin4;
  BlockSet *__range4;
  Block *Child;
  iterator __end3_1;
  iterator __begin3_1;
  BlockSet *__range3_1;
  BlockList ToInvalidate;
  BlockSet *CurrGroup;
  Block *Entry_1;
  iterator __end2_1;
  iterator __begin2_1;
  BlockSet *__range2_1;
  Block *NewOwner;
  _Self local_f0;
  iterator Known;
  type *_;
  type *New;
  _Self local_d0;
  iterator __end3;
  iterator __begin3;
  BlockBranchMap *__range3;
  Block *Owner;
  Block *Curr;
  Block *Entry;
  iterator __end2;
  _Self local_88;
  iterator __begin2;
  BlockSet *__range2;
  BlockList Queue;
  HelperClass Helper;
  BlockSet *Ignore_local;
  BlockBlockSetMap *IndependentGroups_local;
  BlockSet *Entries_local;
  Analyzer *this_local;
  
  Helper.Ownership._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)Ignore;
  Block*>*)::HelperClass::HelperClass(wasm::InsertOrderedMap<CFG::Block*,wasm::InsertOrderedSet<CFG
  ::Block_>_>__(&Queue.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node
                 ._M_size,IndependentGroups);
  std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::list
            ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range2);
  __begin2._M_node = (_List_node_base *)Entries;
  local_88._M_node = (_List_node_base *)::wasm::InsertOrderedSet<CFG::Block_*>::begin(Entries);
  Entry = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end
                             ((InsertOrderedSet<CFG::Block_*> *)__begin2._M_node);
  while (bVar3 = std::operator!=(&local_88,(_Self *)&Entry), bVar3) {
    ppBVar10 = std::_List_iterator<CFG::Block_*>::operator*(&local_88);
    pBVar2 = *ppBVar10;
    Curr = pBVar2;
    ppBVar6 = std::
              map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
              ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                            *)&Helper,&Curr);
    *ppBVar6 = pBVar2;
    pIVar8 = ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::
             operator[](IndependentGroups,&Curr);
    ::wasm::InsertOrderedSet<CFG::Block_*>::insert(pIVar8,&Curr);
    std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::push_back
              ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range2,&Curr);
    std::_List_iterator<CFG::Block_*>::operator++(&local_88);
  }
  while (sVar4 = std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::size
                           ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range2),
        sVar4 != 0) {
    ppBVar5 = std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::front
                        ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range2);
    Owner = *ppBVar5;
    std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::pop_front
              ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range2);
    ppBVar6 = std::
              map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
              ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                            *)&Helper,&Owner);
    __range3 = (BlockBranchMap *)*ppBVar6;
    if ((mapped_type)__range3 != (mapped_type)0x0) {
      pBVar7 = &Owner->BranchesOut;
      __end3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(pBVar7);
      local_d0._M_node =
           (_List_node_base *)::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(pBVar7);
      while (bVar3 = std::operator!=(&__end3,&local_d0), bVar3) {
        __in = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*(&__end3)
        ;
        __x = std::get<0ul,CFG::Block*const,CFG::Branch*>(__in);
        Known._M_node = (_Base_ptr)std::get<1ul,CFG::Block*const,CFG::Branch*>(__in);
        local_f0._M_node =
             (_Base_ptr)
             std::
             map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
             ::find((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                     *)&Helper,__x);
        NewOwner = (Block *)std::
                            map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                            ::end((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                                   *)&Helper);
        bVar3 = std::operator==(&local_f0,(_Self *)&NewOwner);
        pBVar7 = __range3;
        if (bVar3) {
          ppBVar6 = std::
                    map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                    ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                                  *)&Helper,__x);
          *ppBVar6 = (mapped_type)pBVar7;
          pIVar8 = ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::
                   operator[](IndependentGroups,(Block **)&__range3);
          ::wasm::InsertOrderedSet<CFG::Block_*>::insert(pIVar8,__x);
          std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::push_back
                    ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range2,__x);
        }
        else {
          ppVar9 = std::_Rb_tree_iterator<std::pair<CFG::Block_*const,_CFG::Block_*>_>::operator->
                             (&local_f0);
          if ((ppVar9->second != (Block *)0x0) && (ppVar9->second != (Block *)__range3)) {
            Block*>*)::HelperClass::InvalidateWithChildren(CFG::Block__
                      (&Queue.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                        _M_node._M_size,*__x);
          }
        }
        std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end3);
      }
    }
  }
  __end2_1 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(Entries);
  Entry_1 = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(Entries);
  while (bVar3 = std::operator!=(&__end2_1,(_Self *)&Entry_1), bVar3) {
    ppBVar10 = std::_List_iterator<CFG::Block_*>::operator*(&__end2_1);
    CurrGroup = (BlockSet *)*ppBVar10;
    ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
    _M_size = (size_t)::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>
                      ::operator[](IndependentGroups,(Block **)&CurrGroup);
    std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::list
              ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range3_1);
    sVar11 = ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
             _M_node._M_size;
    __end3_1 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin
                         ((InsertOrderedSet<CFG::Block_*> *)
                          ToInvalidate.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>
                          ._M_impl._M_node._M_size);
    Child = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end
                               ((InsertOrderedSet<CFG::Block_*> *)sVar11);
    while (bVar3 = std::operator!=(&__end3_1,(_Self *)&Child), bVar3) {
      ppBVar10 = std::_List_iterator<CFG::Block_*>::operator*(&__end3_1);
      __range4 = (BlockSet *)*ppBVar10;
      this_00 = &((Block *)__range4)->BranchesIn;
      __end4 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(this_00);
      Parent = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(this_00);
      while (bVar3 = std::operator!=(&__end4,(_Self *)&Parent), bVar3) {
        ppBVar10 = std::_List_iterator<CFG::Block_*>::operator*(&__end4);
        Invalidatee = *ppBVar10;
        if ((Helper.Ownership._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) ||
           (bVar3 = contains<wasm::InsertOrderedSet<CFG::Block*>,CFG::Block*>
                              ((InsertOrderedSet<CFG::Block_*> *)
                               Helper.Ownership._M_t._M_impl.super__Rb_tree_header._M_node_count,
                               &Invalidatee), !bVar3)) {
          ppBVar6 = std::
                    map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                    ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                                  *)&Helper,&Invalidatee);
          pBVar1 = *ppBVar6;
          ppBVar6 = std::
                    map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                    ::operator[]((map<CFG::Block_*,_CFG::Block_*,_std::less<CFG::Block_*>,_std::allocator<std::pair<CFG::Block_*const,_CFG::Block_*>_>_>
                                  *)&Helper,(key_type *)&__range4);
          if (pBVar1 != *ppBVar6) {
            std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::push_back
                      ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range3_1,
                       (value_type *)&__range4);
          }
        }
        std::_List_iterator<CFG::Block_*>::operator++(&__end4);
      }
      std::_List_iterator<CFG::Block_*>::operator++(&__end3_1);
    }
    while (sVar4 = std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::size
                             ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range3_1),
          sVar4 != 0) {
      ppBVar5 = std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::front
                          ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range3_1);
      pBVar2 = *ppBVar5;
      std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::pop_front
                ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range3_1);
      Block*>*)::HelperClass::InvalidateWithChildren(CFG::Block__
                (&Queue.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl.
                  _M_node._M_size,pBVar2);
    }
    std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::~list
              ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range3_1);
    std::_List_iterator<CFG::Block_*>::operator++(&__end2_1);
  }
  __end2_2 = ::wasm::InsertOrderedSet<CFG::Block_*>::begin(Entries);
  Entry_2 = (Block *)::wasm::InsertOrderedSet<CFG::Block_*>::end(Entries);
  while (bVar3 = std::operator!=(&__end2_2,(_Self *)&Entry_2), bVar3) {
    ppBVar10 = std::_List_iterator<CFG::Block_*>::operator*(&__end2_2);
    local_1a8 = *ppBVar10;
    pIVar8 = ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::
             operator[](IndependentGroups,&local_1a8);
    sVar11 = ::wasm::InsertOrderedSet<CFG::Block_*>::size(pIVar8);
    if (sVar11 == 0) {
      ::wasm::InsertOrderedMap<CFG::Block_*,_wasm::InsertOrderedSet<CFG::Block_*>_>::erase
                (IndependentGroups,&local_1a8);
    }
    std::_List_iterator<CFG::Block_*>::operator++(&__end2_2);
  }
  std::__cxx11::list<CFG::Block_*,_std::allocator<CFG::Block_*>_>::~list
            ((list<CFG::Block_*,_std::allocator<CFG::Block_*>_> *)&__range2);
  Calculate::Analyzer::FindIndependentGroups::HelperClass::~HelperClass
            ((HelperClass *)
             &Queue.super__List_base<CFG::Block_*,_std::allocator<CFG::Block_*>_>._M_impl._M_node.
              _M_size);
  return;
}

Assistant:

void FindIndependentGroups(BlockSet& Entries,
                               BlockBlockSetMap& IndependentGroups,
                               BlockSet* Ignore = nullptr) {
      using BlockBlockMap = std::map<Block*, Block*>;

      struct HelperClass {
        BlockBlockSetMap& IndependentGroups;
        // For each block, which entry it belongs to. We have reached it from
        // there.
        BlockBlockMap Ownership;

        HelperClass(BlockBlockSetMap& IndependentGroupsInit)
          : IndependentGroups(IndependentGroupsInit) {}
        void InvalidateWithChildren(Block* New) { // TODO: rename New
          // Being in the list means you need to be invalidated
          BlockList ToInvalidate;
          ToInvalidate.push_back(New);
          while (ToInvalidate.size() > 0) {
            Block* Invalidatee = ToInvalidate.front();
            ToInvalidate.pop_front();
            Block* Owner = Ownership[Invalidatee];
            // Owner may have been invalidated, do not add to IndependentGroups!
            if (contains(IndependentGroups, Owner)) {
              IndependentGroups[Owner].erase(Invalidatee);
            }
            // may have been seen before and invalidated already
            if (Ownership[Invalidatee]) {
              Ownership[Invalidatee] = nullptr;
              for (auto& [Target, _] : Invalidatee->BranchesOut) {
                auto Known = Ownership.find(Target);
                if (Known != Ownership.end()) {
                  Block* TargetOwner = Known->second;
                  if (TargetOwner) {
                    ToInvalidate.push_back(Target);
                  }
                }
              }
            }
          }
        }
      };
      HelperClass Helper(IndependentGroups);

      // We flow out from each of the entries, simultaneously.
      // When we reach a new block, we add it as belonging to the one we got to
      // it from. If we reach a new block that is already marked as belonging to
      // someone, it is reachable by two entries and is not valid for any of
      // them. Remove it and all it can reach that have been visited.

      // Being in the queue means we just added this item, and we need to add
      // its children
      BlockList Queue;
      for (auto* Entry : Entries) {
        Helper.Ownership[Entry] = Entry;
        IndependentGroups[Entry].insert(Entry);
        Queue.push_back(Entry);
      }
      while (Queue.size() > 0) {
        Block* Curr = Queue.front();
        Queue.pop_front();
        // Curr must be in the ownership map if we are in the queue
        Block* Owner = Helper.Ownership[Curr];
        if (!Owner) {
          // we have been invalidated meanwhile after being reached from two
          // entries
          continue;
        }
        // Add all children
        for (auto& [New, _] : Curr->BranchesOut) {
          auto Known = Helper.Ownership.find(New);
          if (Known == Helper.Ownership.end()) {
            // New node. Add it, and put it in the queue
            Helper.Ownership[New] = Owner;
            IndependentGroups[Owner].insert(New);
            Queue.push_back(New);
            continue;
          }
          Block* NewOwner = Known->second;
          if (!NewOwner) {
            continue; // We reached an invalidated node
          }
          if (NewOwner != Owner) {
            // Invalidate this and all reachable that we have seen - we reached
            // this from two locations
            Helper.InvalidateWithChildren(New);
          }
          // otherwise, we have the same owner, so do nothing
        }
      }

      // Having processed all the interesting blocks, we remain with just one
      // potential issue: If a->b, and a was invalidated, but then b was later
      // reached by someone else, we must invalidate b. To check for this, we go
      // over all elements in the independent groups, if an element has a parent
      // which does *not* have the same owner, we must remove it and all its
      // children.

      for (auto* Entry : Entries) {
        BlockSet& CurrGroup = IndependentGroups[Entry];
        BlockList ToInvalidate;
        for (auto* Child : CurrGroup) {
          for (auto* Parent : Child->BranchesIn) {
            if (Ignore && contains(*Ignore, Parent)) {
              continue;
            }
            if (Helper.Ownership[Parent] != Helper.Ownership[Child]) {
              ToInvalidate.push_back(Child);
            }
          }
        }
        while (ToInvalidate.size() > 0) {
          Block* Invalidatee = ToInvalidate.front();
          ToInvalidate.pop_front();
          Helper.InvalidateWithChildren(Invalidatee);
        }
      }

      // Remove empty groups
      for (auto* Entry : Entries) {
        if (IndependentGroups[Entry].size() == 0) {
          IndependentGroups.erase(Entry);
        }
      }

#ifdef RELOOPER_DEBUG
      PrintDebug("Investigated independent groups:\n");
      for (auto& iter : IndependentGroups) {
        DebugDump(iter.second, " group: ");
      }
#endif
    }